

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_core.hpp
# Opt level: O3

void __thiscall
boost::threadpool::detail::
pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
::worker_destructed(pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
                    *this,shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>
                          *worker)

{
  int iVar1;
  
  do {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_monitor);
  } while (iVar1 == 4);
  this->m_worker_count = this->m_worker_count - 1;
  this->m_active_worker_count = this->m_active_worker_count - 1;
  condition_variable_any::notify_all(&this->m_worker_idle_or_terminated_event);
  if (this->m_terminate_all_workers != false) {
    std::
    vector<boost::shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>,_std::allocator<boost::shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>_>_>
    ::push_back(&this->m_terminated_workers,worker);
  }
  do {
    iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&this->m_monitor);
  } while (iVar1 == 4);
  return;
}

Assistant:

void worker_destructed(shared_ptr<worker_type> worker) volatile
    {
      locking_ptr<pool_type, recursive_mutex> lockedThis(*this, m_monitor);
      m_worker_count--;
      m_active_worker_count--;
      lockedThis->m_worker_idle_or_terminated_event.notify_all();	

      if(m_terminate_all_workers)
      {
        lockedThis->m_terminated_workers.push_back(worker);
      }
    }